

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

bool __thiscall glslang::TParseContext::isRuntimeLength(TParseContext *this,TIntermTyped *base)

{
  char cVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  undefined4 extraout_var_00;
  long *plVar5;
  long *plVar6;
  byte bVar7;
  bool bVar8;
  
  iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])(base);
  lVar4 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x58))
                    ((long *)CONCAT44(extraout_var,iVar2));
  if ((*(uint *)(lVar4 + 8) & 0x7f) == 6) {
    iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x14])(base);
    plVar6 = (long *)CONCAT44(extraout_var_00,iVar2);
    bVar8 = true;
    if ((plVar6 != (long *)0x0) && ((int)plVar6[0x17] == 0x35)) {
      plVar5 = (long *)(**(code **)(*plVar6 + 0x198))(plVar6);
      lVar4 = (**(code **)(*plVar5 + 0x28))(plVar5);
      iVar2 = **(int **)(*(long *)(lVar4 + 0xc0) + 8);
      lVar4 = (**(code **)(*plVar6 + 400))(plVar6);
      iVar3 = (**(code **)(*(long *)(lVar4 + 0x20) + 0x38))(lVar4 + 0x20);
      base = (TIntermTyped *)(ulong)(iVar3 != 0x12);
      if (iVar3 == 0x12) {
        bVar8 = false;
      }
      else {
        plVar6 = (long *)(**(code **)(*plVar6 + 400))(plVar6);
        plVar6 = (long *)(**(code **)(*plVar6 + 0xf0))(plVar6);
        cVar1 = (**(code **)(*plVar6 + 0x128))(plVar6);
        if (cVar1 == '\0') {
          __assert_fail("isStruct()",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                        ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
        }
        bVar8 = iVar2 != (int)((ulong)(*(long *)(plVar6[0xd] + 0x10) - *(long *)(plVar6[0xd] + 8))
                              >> 5) + -1;
      }
    }
    bVar7 = (byte)base;
    if (!bVar8) goto LAB_00427a0a;
  }
  bVar7 = 0;
LAB_00427a0a:
  return (bool)(bVar7 & 1);
}

Assistant:

bool TParseContext::isRuntimeLength(const TIntermTyped& base) const
{
    if (base.getType().getQualifier().storage == EvqBuffer) {
        // in a buffer block
        const TIntermBinary* binary = base.getAsBinaryNode();
        if (binary != nullptr && binary->getOp() == EOpIndexDirectStruct) {
            // is it the last member?
            const int index = binary->getRight()->getAsConstantUnion()->getConstArray()[0].getIConst();

            if (binary->getLeft()->isReference())
                return false;

            const int memberCount = (int)binary->getLeft()->getType().getStruct()->size();
            if (index == memberCount - 1)
                return true;
        }
    }

    return false;
}